

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O0

void __thiscall
PeleLM::zeroBoundaryVisc
          (PeleLM *this,MultiFab **beta,Real param_3,int state_comp,int dst_comp,int ncomp)

{
  bool bVar1;
  Array4<double> *pAVar2;
  long in_RSI;
  long in_RDI;
  Array4<double> *beta_arr;
  Box bx_1;
  Box *ebox;
  MFIter mfi;
  Box edom;
  int dir;
  GeometryData geomdata;
  MFIter *in_stack_fffffffffffffc80;
  MFIter *mfi_00;
  Geometry *in_stack_fffffffffffffc90;
  FabArray<amrex::FArrayBox> *this_00;
  undefined1 local_360 [7];
  undefined1 in_stack_fffffffffffffca7;
  FabArrayBase *in_stack_fffffffffffffca8;
  MFIter *in_stack_fffffffffffffcb0;
  anon_class_232_6_f80487b4 *in_stack_fffffffffffffcc8;
  Box *in_stack_fffffffffffffcd0;
  undefined1 auStack_318 [4];
  int in_stack_fffffffffffffcec;
  MFIter *in_stack_fffffffffffffcf0;
  undefined1 local_278 [64];
  undefined1 *local_238;
  undefined1 local_230 [24];
  uint local_218;
  undefined1 local_214 [24];
  undefined1 local_1fc [12];
  MFIter local_1f0;
  undefined1 local_190 [12];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> abStack_184 [5];
  long local_e0;
  int local_cc;
  undefined1 *local_c8;
  int local_bc;
  RefID local_b8;
  int local_ac;
  FabArray<amrex::FArrayBox> *local_a8;
  int local_9c;
  DataAllocator local_98;
  int local_8c;
  __uniq_ptr_impl<amrex::FabArray<amrex::FArrayBox>,_std::default_delete<amrex::FabArray<amrex::FArrayBox>_>_>
  local_88;
  int local_7c;
  pointer local_78;
  undefined4 local_70;
  int local_6c;
  MultiArray4<double> local_68;
  undefined4 local_60;
  int local_5c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  int local_4c;
  pointer local_48;
  int local_3c;
  undefined1 *local_38;
  int local_2c;
  __uniq_ptr_impl<amrex::FBData<amrex::FArrayBox>,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>_>
  local_28;
  int local_1c;
  unique_ptr<amrex::FabArray<amrex::FArrayBox>,_std::default_delete<amrex::FabArray<amrex::FArrayBox>_>_>
  local_18;
  int local_10;
  int local_c;
  int local_8;
  int local_4;
  
  local_e0 = in_RSI;
  amrex::Geometry::data(in_stack_fffffffffffffc90);
  for (abStack_184[0].field_2._M_allocated_capacity._0_4_ = 0; (int)abStack_184[0].field_2._0_4_ < 3
      ; abStack_184[0].field_2._0_4_ = (undefined4)abStack_184[0].field_2._M_allocated_capacity + 1)
  {
    local_b8.data = (Ref *)amrex::Geometry::Domain((Geometry *)(in_RDI + 0x10));
    local_bc = (undefined4)abStack_184[0].field_2._M_allocated_capacity;
    local_190._0_8_ =
         ((local_b8.data)->m_pmap).super_vector<int,_std::allocator<int>_>.
         super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    unique0x00012000 =
         ((local_b8.data)->m_pmap).super_vector<int,_std::allocator<int>_>.
         super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
    abStack_184[0]._4_8_ =
         ((local_b8.data)->m_pmap).super_vector<int,_std::allocator<int>_>.
         super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    abStack_184[0]._M_string_length._4_4_ =
         *(undefined4 *)
          &((local_b8.data)->m_index_array).super_vector<int,_std::allocator<int>_>.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    this_00 = (FabArray<amrex::FArrayBox> *)local_190;
    local_ac = (undefined4)abStack_184[0].field_2._M_allocated_capacity;
    local_78 = (pointer)((long)&abStack_184[0]._M_string_length + 4);
    local_7c = (undefined4)abStack_184[0].field_2._M_allocated_capacity;
    local_2c = (undefined4)abStack_184[0].field_2._M_allocated_capacity;
    local_c = (undefined4)abStack_184[0].field_2._M_allocated_capacity;
    if ((abStack_184[0]._M_string_length._4_4_ &
        1 << ((byte)(undefined4)abStack_184[0].field_2._M_allocated_capacity & 0x1f)) == 0) {
      local_5c = (undefined4)abStack_184[0].field_2._M_allocated_capacity;
      local_60 = 1;
      *(int *)(&abStack_184[0]._M_dataplus + (long)(int)abStack_184[0].field_2._0_4_ * 4) =
           *(int *)(&abStack_184[0]._M_dataplus + (long)(int)abStack_184[0].field_2._0_4_ * 4) + 1;
      local_38 = (undefined1 *)((long)&abStack_184[0]._M_string_length + 4);
      local_3c = (undefined4)abStack_184[0].field_2._M_allocated_capacity;
      local_8 = (undefined4)abStack_184[0].field_2._M_allocated_capacity;
      abStack_184[0]._M_string_length._4_4_ =
           1 << ((byte)(undefined4)abStack_184[0].field_2._M_allocated_capacity & 0x1f) |
           abStack_184[0]._M_string_length._4_4_;
      local_58 = abStack_184;
    }
    mfi_00 = *(MFIter **)(local_e0 + (long)(int)abStack_184[0].field_2._0_4_ * 8);
    local_a8 = this_00;
    local_28._M_t.
    super__Tuple_impl<0UL,_amrex::FBData<amrex::FArrayBox>_*,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>_>
    .super__Head_base<0UL,_amrex::FBData<amrex::FArrayBox>_*,_false>._M_head_impl =
         (tuple<amrex::FBData<amrex::FArrayBox>_*,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>_>
          )(tuple<amrex::FBData<amrex::FArrayBox>_*,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>_>
            )local_78;
    amrex::TilingIfNotGPU();
    amrex::MFIter::MFIter
              (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,(bool)in_stack_fffffffffffffca7);
    while( true ) {
      bVar1 = amrex::MFIter::isValid(&local_1f0);
      if (!bVar1) break;
      amrex::MFIter::growntilebox(in_stack_fffffffffffffcf0,in_stack_fffffffffffffcec);
      local_c8 = local_230;
      local_cc = (undefined4)abStack_184[0].field_2._M_allocated_capacity;
      in_stack_fffffffffffffc80 = (MFIter *)local_214;
      local_9c = (undefined4)abStack_184[0].field_2._M_allocated_capacity;
      local_88._M_t.
      super__Tuple_impl<0UL,_amrex::FabArray<amrex::FArrayBox>_*,_std::default_delete<amrex::FabArray<amrex::FArrayBox>_>_>
      .super__Head_base<0UL,_amrex::FabArray<amrex::FArrayBox>_*,_false>._M_head_impl =
           (tuple<amrex::FabArray<amrex::FArrayBox>_*,_std::default_delete<amrex::FabArray<amrex::FArrayBox>_>_>
            )local_1fc;
      local_8c = (undefined4)abStack_184[0].field_2._M_allocated_capacity;
      local_1c = (undefined4)abStack_184[0].field_2._M_allocated_capacity;
      local_10 = (undefined4)abStack_184[0].field_2._M_allocated_capacity;
      if ((local_218 & 1 << ((byte)(undefined4)abStack_184[0].field_2._M_allocated_capacity & 0x1f))
          == 0) {
        pAVar2 = (Array4<double> *)(local_214 + 0xc);
        local_6c = (undefined4)abStack_184[0].field_2._M_allocated_capacity;
        local_70 = 1;
        *(int *)((long)&pAVar2->p + (long)(int)abStack_184[0].field_2._0_4_ * 4) =
             *(int *)((long)&pAVar2->p + (long)(int)abStack_184[0].field_2._0_4_ * 4) + 1;
        local_48 = (pointer)local_1fc;
        local_4c = (undefined4)abStack_184[0].field_2._M_allocated_capacity;
        local_4 = (undefined4)abStack_184[0].field_2._M_allocated_capacity;
        local_68.hp = pAVar2;
      }
      local_1fc._4_8_ = local_214;
      local_98.m_arena = (Arena *)in_stack_fffffffffffffc80;
      local_18._M_t.
      super___uniq_ptr_impl<amrex::FabArray<amrex::FArrayBox>,_std::default_delete<amrex::FabArray<amrex::FArrayBox>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_amrex::FabArray<amrex::FArrayBox>_*,_std::default_delete<amrex::FabArray<amrex::FArrayBox>_>_>
      .super__Head_base<0UL,_amrex::FabArray<amrex::FArrayBox>_*,_false>._M_head_impl =
           (__uniq_ptr_data<amrex::FabArray<amrex::FArrayBox>,_std::default_delete<amrex::FabArray<amrex::FArrayBox>_>,_true,_true>
            )(__uniq_ptr_data<amrex::FabArray<amrex::FArrayBox>,_std::default_delete<amrex::FabArray<amrex::FArrayBox>_>,_true,_true>
              )local_88._M_t.
               super__Tuple_impl<0UL,_amrex::FabArray<amrex::FArrayBox>_*,_std::default_delete<amrex::FabArray<amrex::FArrayBox>_>_>
               .super__Head_base<0UL,_amrex::FabArray<amrex::FArrayBox>_*,_false>._M_head_impl;
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (this_00,mfi_00,(int)((ulong)in_stack_fffffffffffffc80 >> 0x20));
      local_238 = local_278;
      memcpy(local_360,local_238,0x3c);
      memcpy(auStack_318,(void *)((long)&abStack_184[0].field_2 + 4),0x78);
      amrex::ParallelFor<PeleLM::zeroBoundaryVisc(amrex::MultiFab**,double,int,int,int)const::__0>
                (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
      amrex::MFIter::operator++(&local_1f0);
    }
    amrex::MFIter::~MFIter(in_stack_fffffffffffffc80);
  }
  return;
}

Assistant:

void
PeleLM::zeroBoundaryVisc (MultiFab*  beta[AMREX_SPACEDIM],
                          const Real /*time*/,
                          const int  state_comp,
                          const int  dst_comp,
                          const int  ncomp) const
{
  AMREX_ASSERT(state_comp > Density);

  const auto geomdata = geom.data();

  for (int dir = 0; dir < AMREX_SPACEDIM; dir++)
  {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    {
      const Box edom = amrex::surroundingNodes(geom.Domain(),dir);
      for (MFIter mfi(*(beta[dir]),TilingIfNotGPU()); mfi.isValid(); ++mfi)
      {
        const Box& ebox     = amrex::surroundingNodes(mfi.growntilebox(),dir);
        auto const& beta_arr = beta[dir]->array(mfi,dst_comp);
        amrex::ParallelFor(ebox, [beta_arr,dir,geomdata,edom,state_comp,ncomp]
        AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
          zero_visc(i, j, k, beta_arr, geomdata, edom, dir, state_comp, ncomp);
        });
      }
    }
  }
}